

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O3

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  long lVar15;
  int *piVar16;
  int *piVar17;
  int *piVar18;
  long lVar19;
  size_t sVar20;
  void *pvVar21;
  int *piVar22;
  uint uVar23;
  Mat *pMVar24;
  void *pvVar25;
  void *pvVar26;
  float *pfVar27;
  int *piVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  int *piVar32;
  ulong uVar33;
  int *piVar34;
  int *piVar35;
  uint _c;
  int iVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  uint uVar41;
  int *piVar42;
  undefined4 *puVar43;
  float fVar44;
  undefined1 auVar45 [16];
  float fVar46;
  undefined1 auVar47 [16];
  int iVar49;
  undefined1 auVar48 [16];
  int *local_100;
  void *local_f8;
  int *local_f0;
  size_t local_e8;
  int *local_e0;
  int *local_d8;
  int *local_d0;
  int *local_c8;
  int *local_c0;
  int *local_b8;
  int *local_b0;
  int *local_a8;
  void *local_a0;
  int *local_98;
  int *local_90;
  int *local_88;
  void *local_80;
  int *local_78;
  Interp *local_70;
  ulong local_68;
  float *local_60;
  Mat *local_58;
  Mat *local_50;
  float *local_48;
  int *local_40;
  float *local_38;
  
  uVar41 = this->output_width;
  uVar37 = this->output_height;
  if (bottom_blob->dims == 1) {
    uVar23 = 1;
    uVar38 = 1;
    _c = bottom_blob->w;
  }
  else {
    uVar23 = bottom_blob->h;
    _c = bottom_blob->c;
    uVar38 = bottom_blob->w;
  }
  local_e0 = (int *)(ulong)uVar38;
  local_c8 = (int *)(ulong)uVar23;
  if (uVar41 == 0 || uVar37 == 0) {
    uVar37 = (uint)((float)(int)uVar23 * this->height_scale);
    uVar41 = (uint)((float)(int)uVar38 * this->width_scale);
  }
  piVar18 = (int *)(ulong)uVar37;
  if ((uVar37 == uVar23) && (uVar41 == uVar38)) {
    if (top_blob != bottom_blob) {
      piVar18 = bottom_blob->refcount;
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + 1;
        UNLOCK();
      }
      piVar18 = top_blob->refcount;
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + -1;
        UNLOCK();
        if (*piVar18 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      piVar18 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar18;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar14 = bottom_blob->w;
      iVar49 = bottom_blob->h;
      iVar29 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar14;
      top_blob->h = iVar49;
      top_blob->c = iVar29;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  local_70 = this;
  Mat::create(top_blob,uVar41,uVar37,_c,bottom_blob->elemsize,opt->blob_allocator);
  auVar13 = _DAT_00175250;
  auVar12 = _DAT_00175240;
  auVar11 = _DAT_00175230;
  pvVar26 = top_blob->data;
  if (pvVar26 == (void *)0x0) {
    return -100;
  }
  sVar6 = top_blob->cstep;
  if ((long)top_blob->c * sVar6 == 0) {
    return -100;
  }
  if (bottom_blob->dims == 1) {
    if (0 < (int)_c) {
      uVar41 = top_blob->h * top_blob->w;
      pvVar25 = bottom_blob->data;
      lVar15 = (ulong)uVar41 - 1;
      auVar45._8_4_ = (int)lVar15;
      auVar45._0_8_ = lVar15;
      auVar45._12_4_ = (int)((ulong)lVar15 >> 0x20);
      lVar15 = (long)pvVar26 + 0xc;
      sVar20 = top_blob->elemsize;
      uVar31 = 0;
      auVar45 = auVar45 ^ _DAT_00175230;
      do {
        if (0 < (int)uVar41) {
          uVar4 = *(undefined4 *)((long)pvVar25 + uVar31 * 4);
          uVar33 = 0;
          do {
            auVar47._8_4_ = (int)uVar33;
            auVar47._0_8_ = uVar33;
            auVar47._12_4_ = (int)(uVar33 >> 0x20);
            auVar48 = (auVar47 | auVar13) ^ auVar11;
            iVar14 = auVar45._4_4_;
            if ((bool)(~(iVar14 < auVar48._4_4_ ||
                        auVar45._0_4_ < auVar48._0_4_ && auVar48._4_4_ == iVar14) & 1)) {
              *(undefined4 *)(lVar15 + -0xc + uVar33 * 4) = uVar4;
            }
            if (auVar48._12_4_ <= auVar45._12_4_ &&
                (auVar48._8_4_ <= auVar45._8_4_ || auVar48._12_4_ != auVar45._12_4_)) {
              *(undefined4 *)(lVar15 + -8 + uVar33 * 4) = uVar4;
            }
            auVar47 = (auVar47 | auVar12) ^ auVar11;
            iVar49 = auVar47._4_4_;
            if (iVar49 <= iVar14 && (iVar49 != iVar14 || auVar47._0_4_ <= auVar45._0_4_)) {
              *(undefined4 *)(lVar15 + -4 + uVar33 * 4) = uVar4;
              *(undefined4 *)(lVar15 + uVar33 * 4) = uVar4;
            }
            uVar33 = uVar33 + 4;
          } while ((uVar41 + 3 & 0xfffffffc) != uVar33);
        }
        uVar31 = uVar31 + 1;
        lVar15 = lVar15 + sVar6 * sVar20;
      } while (uVar31 != _c);
    }
  }
  else {
    iVar14 = local_70->resize_type;
    local_98 = (int *)CONCAT44(local_98._4_4_,_c);
    local_78 = piVar18;
    local_58 = top_blob;
    local_50 = bottom_blob;
    if (iVar14 == 2) {
      iVar14 = uVar41 * 3 + uVar37 * 3;
      uVar31 = 0xffffffffffffffff;
      if (-1 < iVar14) {
        uVar31 = (long)iVar14 * 4;
      }
      piVar16 = (int *)operator_new__(uVar31);
      pMVar24 = local_50;
      local_f8 = (void *)(long)(int)uVar41;
      piVar18 = piVar16 + (long)local_f8;
      local_e8 = (size_t)(int)uVar37;
      pfVar27 = (float *)(piVar18 + local_e8);
      linear_coeffs((int)local_e0,uVar41,piVar16,pfVar27);
      local_d0 = piVar18;
      local_60 = pfVar27 + (int)(uVar41 * 2);
      linear_coeffs((int)local_c8,(int)local_78,piVar18,pfVar27 + (int)(uVar41 * 2));
      sVar6 = local_e8;
      pvVar26 = local_f8;
      if (0 < (int)_c) {
        local_90 = (int *)((ulong)local_98 & 0xffffffff);
        piVar18 = (int *)0x0;
        do {
          local_68 = CONCAT44(local_68._4_4_,pMVar24->w);
          local_d8 = (int *)pMVar24->elemsize;
          local_80 = (void *)(pMVar24->cstep * (long)piVar18 * (long)local_d8 + (long)pMVar24->data)
          ;
          uVar37 = local_58->w;
          pvVar21 = (void *)(long)(int)uVar37;
          local_e8 = (size_t)(uint)local_58->h;
          pvVar25 = local_58->data;
          local_f8 = (void *)local_58->elemsize;
          piVar22 = (int *)local_58->cstep;
          local_a8 = piVar18;
          if (pvVar21 == (void *)0x0) {
            local_b8 = (int *)0x0;
            local_f0 = (int *)0x0;
            local_c0 = (int *)0x0;
            local_b0 = (int *)0x0;
          }
          else {
            sVar3 = (long)pvVar21 * 4 + 4;
            local_100 = (int *)0x0;
            local_88 = piVar22;
            iVar14 = posix_memalign(&local_100,0x10,sVar3);
            local_f0 = local_100;
            local_b8 = (int *)0x0;
            if (iVar14 == 0) {
              local_b8 = local_100;
            }
            local_b8 = local_b8 + (long)pvVar21;
            *local_b8 = 1;
            local_100 = (int *)0x0;
            iVar14 = posix_memalign(&local_100,0x10,sVar3);
            local_b0 = local_100;
            local_c0 = (int *)0x0;
            if (iVar14 == 0) {
              local_c0 = local_100;
            }
            local_c0 = local_c0 + (long)pvVar21;
            *local_c0 = 1;
            piVar22 = local_88;
          }
          if (0 < (int)local_e8) {
            lVar15 = (long)piVar22 * (long)local_f8;
            local_f8 = (void *)((long)local_f8 * (long)pvVar21);
            pvVar25 = (void *)((long)pvVar25 + lVar15 * (long)local_a8);
            sVar20 = 0;
            pfVar27 = local_60;
            piVar18 = local_f0;
            piVar22 = local_b0;
            iVar14 = -2;
            do {
              iVar49 = local_d0[sVar20];
              piVar17 = piVar18;
              if (iVar49 == iVar14) {
LAB_00169466:
                if (0 < (int)uVar37) {
                  fVar44 = *pfVar27;
                  fVar46 = pfVar27[1];
                  lVar15 = 0;
                  do {
                    *(float *)((long)pvVar25 + lVar15 * 4) =
                         (float)piVar22[lVar15] * fVar46 + (float)piVar17[lVar15] * fVar44;
                    lVar15 = lVar15 + 1;
                  } while (uVar37 != (uint)lVar15);
                }
              }
              else if (iVar49 == iVar14 + 1) {
                piVar17 = piVar22;
                piVar22 = piVar18;
                if (0 < (int)uVar37) {
                  uVar31 = 0;
                  do {
                    uVar5 = *(undefined8 *)
                             ((long)local_80 +
                             (long)piVar16[uVar31] * 4 +
                             (long)((iVar49 + 1) * (int)local_68) * (long)local_d8);
                    piVar18[uVar31] =
                         (int)((float)((ulong)uVar5 >> 0x20) *
                               (float)((ulong)*(undefined8 *)
                                               (piVar16 + (long)pvVar26 + sVar6 + uVar31 * 2) >>
                                      0x20) +
                              (float)uVar5 *
                              (float)*(undefined8 *)(piVar16 + (long)pvVar26 + sVar6 + uVar31 * 2));
                    uVar31 = uVar31 + 1;
                  } while (uVar37 != uVar31);
                  goto LAB_00169466;
                }
              }
              else if (0 < (int)uVar37) {
                uVar31 = 0;
                do {
                  iVar14 = piVar16[uVar31];
                  uVar5 = *(undefined8 *)
                           ((long)local_80 +
                           (long)iVar14 * 4 + (long)(iVar49 * (int)local_68) * (long)local_d8);
                  fVar44 = (float)*(undefined8 *)(piVar16 + (long)pvVar26 + sVar6 + uVar31 * 2);
                  fVar46 = (float)((ulong)*(undefined8 *)
                                           (piVar16 + (long)pvVar26 + sVar6 + uVar31 * 2) >> 0x20);
                  piVar18[uVar31] =
                       (int)((float)((ulong)uVar5 >> 0x20) * fVar46 + (float)uVar5 * fVar44);
                  uVar5 = *(undefined8 *)
                           ((long)local_80 +
                           (long)iVar14 * 4 + (long)((iVar49 + 1) * (int)local_68) * (long)local_d8)
                  ;
                  piVar22[uVar31] =
                       (int)((float)((ulong)uVar5 >> 0x20) * fVar46 + (float)uVar5 * fVar44);
                  uVar31 = uVar31 + 1;
                } while (uVar37 != uVar31);
                goto LAB_00169466;
              }
              pfVar27 = pfVar27 + 2;
              sVar20 = sVar20 + 1;
              pvVar25 = (void *)((long)pvVar25 + (long)local_f8);
              piVar18 = piVar17;
              iVar14 = iVar49;
              local_a0 = pvVar21;
            } while (sVar20 != local_e8);
          }
          if (local_c0 != (int *)0x0) {
            LOCK();
            *local_c0 = *local_c0 + -1;
            UNLOCK();
            if (local_b0 != (int *)0x0 && *local_c0 == 0) {
              free(local_b0);
            }
          }
          pMVar24 = local_50;
          if (local_b8 != (int *)0x0) {
            LOCK();
            *local_b8 = *local_b8 + -1;
            UNLOCK();
            if (local_f0 != (int *)0x0 && *local_b8 == 0) {
              free(local_f0);
            }
          }
          piVar18 = (int *)((long)local_a8 + 1);
        } while (piVar18 != local_90);
      }
      operator_delete__(piVar16);
      iVar14 = local_70->resize_type;
      uVar37 = (uint)local_78;
    }
    else if (iVar14 == 1) {
      if (local_70->output_height == 0) {
        fVar44 = 1.0 / local_70->height_scale;
      }
      else {
        fVar44 = (float)(int)local_c8 / (float)local_70->output_height;
      }
      iVar49 = (int)local_e0;
      if (local_70->output_width == 0) {
        fVar46 = 1.0 / local_70->width_scale;
      }
      else {
        fVar46 = (float)iVar49 / (float)local_70->output_width;
      }
      if ((int)_c < 1) {
        return 0;
      }
      local_e8 = CONCAT44(local_e8._4_4_,1);
      local_f8 = bottom_blob->data;
      sVar20 = bottom_blob->cstep;
      sVar7 = bottom_blob->elemsize;
      sVar8 = top_blob->elemsize;
      iVar29 = (int)local_c8 + -1;
      uVar31 = 0;
      do {
        if (0 < (int)uVar37) {
          puVar43 = (undefined4 *)(sVar6 * sVar8 * uVar31 + (long)pvVar26);
          uVar23 = 0;
          do {
            if (0 < (int)uVar41) {
              iVar36 = (int)((float)(int)uVar23 * fVar44);
              if (iVar29 < (int)((float)(int)uVar23 * fVar44)) {
                iVar36 = iVar29;
              }
              uVar38 = 0;
              do {
                iVar30 = iVar49 + -1;
                if ((int)((float)(int)uVar38 * fVar46) <= iVar49 + -1) {
                  iVar30 = (int)((float)(int)uVar38 * fVar46);
                }
                *puVar43 = *(undefined4 *)
                            ((long)local_f8 +
                            (long)(iVar30 + iVar36 * iVar49) * 4 + sVar20 * sVar7 * uVar31);
                puVar43 = puVar43 + 1;
                uVar38 = uVar38 + 1;
              } while (uVar41 != uVar38);
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar37);
        }
        uVar31 = uVar31 + 1;
      } while (uVar31 != _c);
    }
    if (iVar14 != 3) {
      return 0;
    }
    iVar14 = uVar41 * 5 + uVar37 * 5;
    uVar31 = 0xffffffffffffffff;
    if (-1 < iVar14) {
      uVar31 = (long)iVar14 * 4;
    }
    local_f0 = (int *)operator_new__(uVar31);
    pMVar24 = local_50;
    local_f8 = (void *)(long)(int)uVar41;
    piVar18 = local_f0 + (long)local_f8;
    pfVar27 = (float *)(piVar18 + (int)uVar37);
    cubic_coeffs((int)local_e0,uVar41,local_f0,pfVar27);
    local_d8 = piVar18;
    local_48 = pfVar27 + (int)(uVar41 * 4);
    cubic_coeffs((int)local_c8,uVar37,piVar18,pfVar27 + (int)(uVar41 * 4));
    if (0 < (int)local_98) {
      local_40 = (int *)((ulong)local_98 & 0xffffffff);
      piVar18 = local_f0 + (long)local_f8 + (long)(int)uVar37;
      piVar16 = (int *)0x0;
      local_78 = piVar18;
      do {
        local_a8 = (int *)CONCAT44(local_a8._4_4_,pMVar24->w);
        local_d0 = (int *)pMVar24->elemsize;
        local_a0 = (void *)(pMVar24->cstep * (long)piVar16 * (long)local_d0 + (long)pMVar24->data);
        pvVar25 = (void *)(long)local_58->w;
        local_68 = (ulong)(uint)local_58->h;
        pvVar26 = local_58->data;
        local_e8 = local_58->elemsize;
        sVar6 = local_58->cstep;
        local_b0 = piVar16;
        local_80 = pvVar25;
        if (pvVar25 == (void *)0x0) {
          local_b8 = (int *)0x0;
          local_70 = (Interp *)0x0;
          local_c8 = (int *)0x0;
          local_c0 = (int *)0x0;
          local_60 = (float *)0x0;
          local_88 = (int *)0x0;
          local_98 = (int *)0x0;
          local_90 = (int *)0x0;
        }
        else {
          sVar3 = (long)pvVar25 * 4 + 4;
          local_100 = (int *)0x0;
          iVar14 = posix_memalign(&local_100,0x10,sVar3);
          local_b8 = local_100;
          piVar16 = (int *)0x0;
          if (iVar14 == 0) {
            piVar16 = local_100;
          }
          local_70 = (Interp *)(piVar16 + (long)pvVar25);
          *(int *)&(local_70->super_Layer)._vptr_Layer = 1;
          local_100 = (int *)0x0;
          iVar14 = posix_memalign(&local_100,0x10,sVar3);
          local_c0 = local_100;
          local_c8 = (int *)0x0;
          if (iVar14 == 0) {
            local_c8 = local_100;
          }
          local_c8 = local_c8 + (long)pvVar25;
          *local_c8 = 1;
          local_100 = (int *)0x0;
          iVar14 = posix_memalign(&local_100,0x10,sVar3);
          local_88 = local_100;
          piVar16 = (int *)0x0;
          if (iVar14 == 0) {
            piVar16 = local_100;
          }
          local_60 = (float *)(piVar16 + (long)pvVar25);
          *local_60 = 1.4013e-45;
          local_100 = (int *)0x0;
          iVar14 = posix_memalign(&local_100,0x10,sVar3);
          local_90 = local_100;
          piVar16 = (int *)0x0;
          if (iVar14 == 0) {
            piVar16 = local_100;
          }
          local_98 = piVar16 + (long)pvVar25;
          *local_98 = 1;
        }
        if (0 < (int)local_68) {
          local_a0 = (void *)((long)local_a0 + -4);
          lVar15 = ((ulong)local_80 & 0xffffffff) * 4;
          pvVar26 = (void *)((long)pvVar26 + sVar6 * local_e8 * (long)local_b0);
          local_e8 = local_e8 * (long)local_80;
          uVar33 = 0;
          piVar16 = local_c0;
          piVar22 = local_88;
          piVar17 = local_90;
          pfVar27 = local_48;
          piVar34 = local_b8;
          uVar31 = 0xfffffffd;
          do {
            uVar41 = local_d8[uVar33];
            uVar39 = (ulong)uVar41;
            uVar37 = (uint)uVar31;
            iVar14 = (int)local_80;
            piVar28 = piVar17;
            piVar32 = piVar34;
            piVar35 = piVar22;
            piVar42 = piVar16;
            if (uVar41 == uVar37) {
LAB_00169aa4:
              local_f8 = (void *)uVar39;
              if (0 < iVar14) {
                fVar44 = *pfVar27;
                fVar46 = pfVar27[1];
                fVar9 = pfVar27[2];
                fVar10 = pfVar27[3];
                lVar19 = 0;
                do {
                  *(float *)((long)pvVar26 + lVar19 * 4) =
                       (float)piVar28[lVar19] * fVar10 + (float)piVar42[lVar19] * fVar46 +
                       (float)piVar35[lVar19] * fVar9 + (float)piVar32[lVar19] * fVar44;
                  lVar19 = lVar19 + 1;
                } while (iVar14 != (int)lVar19);
              }
            }
            else if (uVar41 == uVar37 + 1) {
              piVar28 = piVar34;
              piVar32 = piVar16;
              piVar35 = piVar17;
              piVar42 = piVar22;
              if (0 < iVar14) {
                lVar19 = 0;
                do {
                  pfVar2 = (float *)(piVar18 + lVar19);
                  pfVar1 = (float *)((long)local_a0 +
                                    (long)*(int *)((long)local_f0 + lVar19) * 4 +
                                    (long)(int)((uVar41 + 2) * (int)local_a8) * (long)local_d0);
                  *(float *)((long)piVar34 + lVar19) =
                       pfVar1[3] * pfVar2[3] + pfVar1[1] * pfVar2[1] +
                       pfVar1[2] * pfVar2[2] + *pfVar1 * *pfVar2;
                  lVar19 = lVar19 + 4;
                } while (lVar15 - lVar19 != 0);
                goto LAB_00169aa4;
              }
            }
            else if (uVar41 == uVar37 + 2) {
              piVar28 = piVar16;
              piVar32 = piVar22;
              piVar35 = piVar34;
              piVar42 = piVar17;
              if (0 < iVar14) {
                lVar19 = 0;
                do {
                  iVar49 = *(int *)((long)local_f0 + lVar19);
                  pfVar2 = (float *)(piVar18 + lVar19);
                  fVar44 = *pfVar2;
                  fVar46 = pfVar2[1];
                  fVar9 = pfVar2[2];
                  fVar10 = pfVar2[3];
                  pfVar2 = (float *)((long)local_a0 +
                                    (long)iVar49 * 4 +
                                    (long)(int)((uVar41 + 1) * (int)local_a8) * (long)local_d0);
                  *(float *)((long)piVar34 + lVar19) =
                       pfVar2[3] * fVar10 + pfVar2[1] * fVar46 +
                       pfVar2[2] * fVar9 + *pfVar2 * fVar44;
                  pfVar2 = (float *)((long)local_a0 +
                                    (long)iVar49 * 4 +
                                    (long)(int)((uVar41 + 2) * (int)local_a8) * (long)local_d0);
                  *(float *)((long)piVar16 + lVar19) =
                       pfVar2[3] * fVar10 + pfVar2[1] * fVar46 +
                       pfVar2[2] * fVar9 + *pfVar2 * fVar44;
                  lVar19 = lVar19 + 4;
                  local_e0 = piVar17;
                } while (lVar15 - lVar19 != 0);
                goto LAB_00169aa4;
              }
            }
            else if (uVar41 == uVar37 + 3) {
              piVar28 = piVar22;
              piVar32 = piVar17;
              piVar35 = piVar16;
              piVar42 = piVar34;
              if (0 < iVar14) {
                lVar19 = 0;
                do {
                  lVar40 = (long)*(int *)((long)local_f0 + lVar19);
                  pfVar2 = (float *)(piVar18 + lVar19);
                  fVar44 = *pfVar2;
                  fVar46 = pfVar2[1];
                  fVar9 = pfVar2[2];
                  fVar10 = pfVar2[3];
                  pfVar2 = (float *)((long)local_a0 +
                                    lVar40 * 4 +
                                    (long)(int)(uVar41 * (int)local_a8) * (long)local_d0);
                  *(float *)((long)piVar34 + lVar19) =
                       pfVar2[3] * fVar10 + pfVar2[1] * fVar46 +
                       pfVar2[2] * fVar9 + *pfVar2 * fVar44;
                  pfVar2 = (float *)((long)local_a0 +
                                    lVar40 * 4 +
                                    (long)(int)((uVar41 + 1) * (int)local_a8) * (long)local_d0);
                  *(float *)((long)piVar16 + lVar19) =
                       pfVar2[3] * fVar10 + pfVar2[1] * fVar46 +
                       pfVar2[2] * fVar9 + *pfVar2 * fVar44;
                  pfVar2 = (float *)((long)local_a0 +
                                    lVar40 * 4 +
                                    (long)(int)((uVar41 + 2) * (int)local_a8) * (long)local_d0);
                  *(float *)((long)piVar22 + lVar19) =
                       pfVar2[3] * fVar10 + pfVar2[1] * fVar46 +
                       pfVar2[2] * fVar9 + *pfVar2 * fVar44;
                  lVar19 = lVar19 + 4;
                  local_e0 = piVar17;
                } while (lVar15 - lVar19 != 0);
                goto LAB_00169aa4;
              }
            }
            else if (0 < iVar14) {
              local_e0 = (int *)((long)(int)((uVar41 - 1) * (int)local_a8) * (long)local_d0 +
                                (long)local_a0);
              lVar19 = 0;
              do {
                lVar40 = (long)*(int *)((long)local_f0 + lVar19);
                pfVar2 = (float *)(local_78 + lVar19);
                fVar44 = *pfVar2;
                fVar46 = pfVar2[1];
                fVar9 = pfVar2[2];
                fVar10 = pfVar2[3];
                pfVar2 = (float *)(local_e0 + lVar40);
                *(float *)((long)piVar34 + lVar19) =
                     pfVar2[3] * fVar10 + pfVar2[1] * fVar46 + pfVar2[2] * fVar9 + *pfVar2 * fVar44;
                pfVar2 = (float *)((long)local_a0 +
                                  lVar40 * 4 + (long)(int)(uVar41 * (int)local_a8) * (long)local_d0)
                ;
                *(float *)((long)piVar16 + lVar19) =
                     pfVar2[3] * fVar10 + pfVar2[1] * fVar46 + pfVar2[2] * fVar9 + *pfVar2 * fVar44;
                pfVar2 = (float *)((long)local_a0 +
                                  lVar40 * 4 +
                                  (long)(int)((uVar41 + 1) * (int)local_a8) * (long)local_d0);
                *(float *)((long)piVar22 + lVar19) =
                     pfVar2[3] * fVar10 + pfVar2[1] * fVar46 + pfVar2[2] * fVar9 + *pfVar2 * fVar44;
                pfVar2 = (float *)((long)local_a0 +
                                  lVar40 * 4 +
                                  (long)(int)((uVar41 + 2) * (int)local_a8) * (long)local_d0);
                *(float *)((long)piVar17 + lVar19) =
                     pfVar2[3] * fVar10 + pfVar2[1] * fVar46 + pfVar2[2] * fVar9 + *pfVar2 * fVar44;
                lVar19 = lVar19 + 4;
                piVar18 = local_78;
                local_38 = pfVar27;
              } while (lVar15 - lVar19 != 0);
              goto LAB_00169aa4;
            }
            piVar16 = piVar42;
            piVar22 = piVar35;
            pfVar27 = pfVar27 + 4;
            uVar33 = uVar33 + 1;
            pvVar26 = (void *)((long)pvVar26 + local_e8);
            piVar17 = piVar28;
            piVar34 = piVar32;
            uVar31 = uVar39;
          } while (uVar33 != local_68);
        }
        if (local_98 != (int *)0x0) {
          LOCK();
          *local_98 = *local_98 + -1;
          UNLOCK();
          if (local_90 != (int *)0x0 && *local_98 == 0) {
            free(local_90);
          }
        }
        pMVar24 = local_50;
        if (local_60 != (float *)0x0) {
          LOCK();
          *local_60 = (float)((int)*local_60 + -1);
          UNLOCK();
          if (local_88 != (int *)0x0 && *local_60 == 0.0) {
            free(local_88);
          }
        }
        if (local_c8 != (int *)0x0) {
          LOCK();
          *local_c8 = *local_c8 + -1;
          UNLOCK();
          if (local_c0 != (int *)0x0 && *local_c8 == 0) {
            free(local_c0);
          }
        }
        if (local_70 != (Interp *)0x0) {
          LOCK();
          *(int *)&(local_70->super_Layer)._vptr_Layer =
               *(int *)&(local_70->super_Layer)._vptr_Layer + -1;
          UNLOCK();
          if (local_b8 != (int *)0x0 && *(int *)&(local_70->super_Layer)._vptr_Layer == 0) {
            free(local_b8);
          }
        }
        piVar16 = (int *)((long)local_b0 + 1);
      } while (piVar16 != local_40);
    }
    operator_delete__(local_f0);
  }
  return 0;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outh = output_height;
    int outw = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        channels = bottom_blob.w;
    }
    if (outh == 0 || outw == 0)
    {
        outh = static_cast<int>(h * height_scale);
        outw = static_cast<int>(w * width_scale);
    }
    if (outh == h && outw == w)
    {
        top_blob = bottom_blob;
        return 0;
    }

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)// nearest
    {
        const float hs = output_height ? h / (float)output_height : 1.f / height_scale;
        const float ws = output_width ? w / (float)output_width : 1.f / width_scale;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            for (int y = 0; y < outh; y++)
            {
                int in_y = std::min((int) (y * hs), (h - 1));
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int) (x * ws), (w - 1));
                    *outptr++ = ptr[in_y * w + in_x];
                }
            }
        }
    }

    if (resize_type == 2)// bilinear
    {
        int* buf = new int[outw + outh + outw*2 + outh*2];

        int* xofs = buf;//new int[outw];
        int* yofs = buf + outw;//new int[outh];

        float* alpha = (float*)(buf + outw + outh);//new float[outw * 2];
        float* beta = (float*)(buf + outw + outh + outw*2);//new float[outh * 2];

        linear_coeffs(w, outw, xofs, alpha);
        linear_coeffs(h, outh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    if (resize_type == 3)// bicubic
    {
        int* buf = new int[outw + outh + outw*4 + outh*4];

        int* xofs = buf;//new int[outw];
        int* yofs = buf + outw;//new int[outh];

        float* alpha = (float*)(buf + outw + outh);//new float[outw * 4];
        float* beta = (float*)(buf + outw + outh + outw*4);//new float[outh * 4];

        cubic_coeffs(w, outw, xofs, alpha);
        cubic_coeffs(h, outh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    return 0;
}